

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

void __thiscall
duckdb_fmt::v6::internal::
arg_formatter_base<duckdb_fmt::v6::buffer_range<char>,_duckdb_fmt::v6::internal::error_handler>::
write_char(arg_formatter_base<duckdb_fmt::v6::buffer_range<char>,_duckdb_fmt::v6::internal::error_handler>
           *this,char_type value)

{
  ulong uVar1;
  buffer<char> *pbVar2;
  size_t sVar3;
  char_writer local_21;
  
  if (this->specs_ == (format_specs *)0x0) {
    pbVar2 = (this->writer_).out_.container;
    sVar3 = pbVar2->size_;
    uVar1 = sVar3 + 1;
    if (pbVar2->capacity_ < uVar1) {
      (**pbVar2->_vptr_buffer)(pbVar2,uVar1);
    }
    pbVar2->size_ = uVar1;
    pbVar2->ptr_[sVar3] = value;
  }
  else {
    basic_writer<duckdb_fmt::v6::buffer_range<char>>::
    write_padded<duckdb_fmt::v6::internal::arg_formatter_base<duckdb_fmt::v6::buffer_range<char>,duckdb_fmt::v6::internal::error_handler>::char_writer>
              ((basic_writer<duckdb_fmt::v6::buffer_range<char>> *)this,this->specs_,&local_21);
  }
  return;
}

Assistant:

void write_char(char_type value) {
    if (specs_)
      writer_.write_padded(*specs_, char_writer{value});
    else
      writer_.write(value);
  }